

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

uint32_t __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_uint32
          (GLAttributeBuffer *this,size_t ind)

{
  uint uVar1;
  allocator local_39;
  string local_38;
  
  if ((this->super_AttributeBuffer).dataType != UInt) {
    std::__cxx11::string::string((string *)&local_38,"bad getData type",&local_39);
    exception(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  uVar1 = getData_helper<unsigned_int>(this,ind);
  return uVar1;
}

Assistant:

uint32_t GLAttributeBuffer::getData_uint32(size_t ind) {
  if (getType() != RenderDataType::UInt) exception("bad getData type");
  return getData_helper<uint32_t>(ind);
}